

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O0

int Tas_ManAnalyze(Tas_Man_t *p,int Level,Gia_Obj_t *pVar,Gia_Obj_t *pFan0,Gia_Obj_t *pFan1)

{
  int iVar1;
  Tas_Que_t *p_00;
  Tas_Que_t *pQue;
  Gia_Obj_t *pFan1_local;
  Gia_Obj_t *pFan0_local;
  Gia_Obj_t *pVar_local;
  int Level_local;
  Tas_Man_t *p_local;
  
  p_00 = &p->pClauses;
  iVar1 = Tas_VarIsAssigned(pVar);
  if (iVar1 == 0) {
    __assert_fail("Tas_VarIsAssigned(pVar)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCTas.c"
                  ,0x350,
                  "int Tas_ManAnalyze(Tas_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar1 = Tas_VarIsAssigned(pFan0);
  if (iVar1 == 0) {
    __assert_fail("Tas_VarIsAssigned(pFan0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCTas.c"
                  ,0x351,
                  "int Tas_ManAnalyze(Tas_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if (pFan1 != (Gia_Obj_t *)0x0) {
    iVar1 = Tas_VarIsAssigned(pFan1);
    if (iVar1 == 0) {
      __assert_fail("pFan1 == NULL || Tas_VarIsAssigned(pFan1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCTas.c"
                    ,0x352,
                    "int Tas_ManAnalyze(Tas_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
  }
  iVar1 = Tas_QueIsEmpty(p_00);
  if (iVar1 != 0) {
    Tas_QuePush(p_00,(Gia_Obj_t *)0x0);
    Tas_QuePush(p_00,pVar);
    Tas_QuePush(p_00,pFan0);
    if (pFan1 != (Gia_Obj_t *)0x0) {
      Tas_QuePush(p_00,pFan1);
    }
    Tas_ManDeriveReason(p,Level);
    iVar1 = Tas_QueFinish(p_00);
    return iVar1;
  }
  __assert_fail("Tas_QueIsEmpty( pQue )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCTas.c"
                ,0x353,"int Tas_ManAnalyze(Tas_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)"
               );
}

Assistant:

static inline int Tas_ManAnalyze( Tas_Man_t * p, int Level, Gia_Obj_t * pVar, Gia_Obj_t * pFan0, Gia_Obj_t * pFan1 )
{
    Tas_Que_t * pQue = &(p->pClauses);
    assert( Tas_VarIsAssigned(pVar) );
    assert( Tas_VarIsAssigned(pFan0) );
    assert( pFan1 == NULL || Tas_VarIsAssigned(pFan1) );
    assert( Tas_QueIsEmpty( pQue ) );
    Tas_QuePush( pQue, NULL );
    Tas_QuePush( pQue, pVar );
    Tas_QuePush( pQue, pFan0 );
    if ( pFan1 )
        Tas_QuePush( pQue, pFan1 );
    Tas_ManDeriveReason( p, Level );
    return Tas_QueFinish( pQue );
}